

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseMetaData(Parser *this,SymbolTable<flatbuffers::Value> *attributes)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  Value *this_00;
  SymbolTable<flatbuffers::Value> *in_RDX;
  CheckedError *ce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  _Base_ptr local_68;
  _Base_ptr *local_60;
  string *local_58;
  string name;
  
  if (*(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4)
      == 0x28) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      local_58 = (string *)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_60 = &attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_68 = (_Base_ptr)
                 &attributes[0xd].dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        std::__cxx11::string::string((string *)&name,local_58);
        iVar2 = *(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left + 4);
        if ((iVar2 != 0x101) && (iVar2 != 0x104)) break;
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)local_60,(key_type *)&name);
        if (iVar3._M_node == local_68) {
          std::operator+(&bStack_88,"user define attributes must be declared before use: ",&name);
          Error(this,(string *)attributes);
          goto LAB_0010921a;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109222;
        CheckedError::~CheckedError((CheckedError *)this);
        this_00 = (Value *)operator_new(0x48);
        Value::Value(this_00);
        bVar1 = SymbolTable<flatbuffers::Value>::Add(in_RDX,&name,this_00);
        if (bVar1) {
          std::operator+(&bStack_88,"attribute already found: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name)
          ;
          Warning((Parser *)attributes,&bStack_88);
          std::__cxx11::string::~string((string *)&bStack_88);
        }
        iVar2 = *(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left + 4);
        if (iVar2 == 0x3a) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109222;
          CheckedError::~CheckedError((CheckedError *)this);
          ParseSingleValue(this,(string *)attributes,(Value *)&name,SUB81(this_00,0));
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109222;
          CheckedError::~CheckedError((CheckedError *)this);
          iVar2 = *(int *)((long)&(attributes->dict)._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left + 4);
        }
        if (iVar2 == 0x29) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            CheckedError::~CheckedError((CheckedError *)this);
            std::__cxx11::string::~string((string *)&name);
            goto LAB_001091f2;
          }
          goto LAB_00109222;
        }
        Expect(this,(int)attributes);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00109222;
        CheckedError::~CheckedError((CheckedError *)this);
        std::__cxx11::string::~string((string *)&name);
      }
      std::operator+(&bStack_88,"attribute name must be either identifier or string: ",&name);
      Error(this,(string *)attributes);
LAB_0010921a:
      std::__cxx11::string::~string((string *)&bStack_88);
LAB_00109222:
      std::__cxx11::string::~string((string *)&name);
    }
  }
  else {
LAB_001091f2:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseMetaData(SymbolTable<Value> *attributes) {
  if (Is('(')) {
    NEXT();
    for (;;) {
      auto name = attribute_;
      if (false == (Is(kTokenIdentifier) || Is(kTokenStringConstant)))
        return Error("attribute name must be either identifier or string: " +
                     name);
      if (known_attributes_.find(name) == known_attributes_.end())
        return Error("user define attributes must be declared before use: " +
                     name);
      NEXT();
      auto e = new Value();
      if (attributes->Add(name, e)) Warning("attribute already found: " + name);
      if (Is(':')) {
        NEXT();
        ECHECK(ParseSingleValue(&name, *e, true));
      }
      if (Is(')')) {
        NEXT();
        break;
      }
      EXPECT(',');
    }
  }
  return NoError();
}